

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

void __thiscall boundingBoxTy::enlarge(boundingBoxTy *this,positionTy *lPos)

{
  long lVar1;
  positionTy *ppVar2;
  positionTy *ppVar3;
  
  if (!NAN((this->nw)._lon)) {
    enlarge_pos(this,lPos->_lat,lPos->_lon);
    return;
  }
  ppVar2 = lPos;
  ppVar3 = &this->se;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    ppVar3->_lat = ppVar2->_lat;
    ppVar2 = (positionTy *)&ppVar2->_lon;
    ppVar3 = (positionTy *)&ppVar3->_lon;
  }
  memmove(this,lPos,0x48);
  return;
}

Assistant:

void boundingBoxTy::enlarge (const positionTy& lPos)
{
    // in the special case that the bounding box isn't initialized
    // we make it the size of this point:
    if (std::isnan(nw.lon())) {
        nw = se = lPos;
        return;
    }
 
    enlarge_pos(lPos.lat(), lPos.lon());
}